

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::EnumAlreadyCreated::~EnumAlreadyCreated(EnumAlreadyCreated *this)

{
  EnumAlreadyCreated *this_local;
  
  Error::~Error(&this->super_Error);
  return;
}

Assistant:

class CAMP_API EnumAlreadyCreated : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param name Name of the enum
     * \param type Identifier of the C++ type
     */
    EnumAlreadyCreated(const std::string& name, const std::string& type);
}